

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.cpp
# Opt level: O2

void __thiscall
embree::fast_allocator_regression_test::thread_alloc
          (fast_allocator_regression_test *this,fast_allocator_regression_test *This)

{
  ThreadLocal *pTVar1;
  atomic<unsigned_long> *paVar2;
  FastAllocator *this_00;
  tuple<embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_> this_01;
  _Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false> _Var3;
  size_t i;
  long *plVar4;
  ThreadLocal2 *this_02;
  ulong uVar5;
  size_t *psVar6;
  size_t sVar7;
  ThreadLocal2 *pTVar8;
  long lVar9;
  undefined1 local_1fc8 [16];
  undefined1 local_1fb8 [24];
  long local_1fa0;
  vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
  *local_1f98;
  Lock<embree::MutexSys> local_1f90;
  unique_ptr<embree::FastAllocator,_std::default_delete<embree::FastAllocator>_> local_1f80;
  size_t *ptrs [1000];
  
  pTVar8 = (ThreadLocal2 *)local_1fc8;
  this_00 = (this->alloc)._M_t.
            super___uniq_ptr_impl<embree::FastAllocator,_std::default_delete<embree::FastAllocator>_>
            ._M_t.
            super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
            .super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl;
  plVar4 = (long *)__tls_get_addr(&PTR_021f7e08);
  this_02 = (ThreadLocal2 *)*plVar4;
  if (this_02 == (ThreadLocal2 *)0x0) {
    this_02 = (ThreadLocal2 *)FastAllocator::ThreadLocal2::operator_new(0xc0);
    MutexSys::MutexSys((MutexSys *)this_02);
    (((string *)&this_02->alloc)->_M_dataplus)._M_p = (pointer)0x0;
    (this_02->alloc0).parent = this_02;
    (this_02->alloc0).ptr = (char *)0x0;
    (this_02->alloc0).cur = 0;
    (this_02->alloc0).end = 0;
    (this_02->alloc0).allocBlockSize = 0;
    (this_02->alloc0).bytesUsed = 0;
    (this_02->alloc0).bytesWasted = 0;
    (this_02->alloc1).parent = this_02;
    (this_02->alloc1).ptr = (char *)0x0;
    (this_02->alloc1).cur = 0;
    (this_02->alloc1).end = 0;
    (this_02->alloc1).allocBlockSize = 0;
    (this_02->alloc1).bytesUsed = 0;
    (this_02->alloc1).bytesWasted = 0;
    *plVar4 = (long)this_02;
    ptrs[0] = &FastAllocator::s_thread_local_allocators_lock;
    ptrs[1]._0_1_ = 1;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    local_1fc8._0_8_ = this_02;
    std::
    vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
    ::
    emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
              ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                *)FastAllocator::s_thread_local_allocators,
               (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                *)local_1fc8);
    std::
    unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
    ::~unique_ptr((unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                   *)local_1fc8);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)ptrs);
    This = (fast_allocator_regression_test *)pTVar8;
  }
  pTVar1 = &this_02->alloc0;
  local_1fb8._8_8_ = &this->barrier;
  local_1f98 = &this_00->thread_local_allocators;
  local_1fa0 = 0;
  local_1fb8._16_8_ = this;
  do {
    if (local_1fa0 == 1000) {
      return;
    }
    BarrierSys::wait((BarrierSys *)local_1fb8._8_8_,This);
    for (lVar9 = 0; lVar9 != 1000; lVar9 = lVar9 + 1) {
      local_1fb8._0_8_ = (ulong)((uint)lVar9 & 0x1f) + 8;
      this_01.
      super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>.
      super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>)
           pTVar1->parent;
      if (this_00 !=
          (((atomic<embree::FastAllocator_*> *)
           ((long)this_01.
                  super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
                  .super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl + 8))->_M_b).
          _M_p) {
        local_1f90.locked = true;
        local_1f90.mutex =
             (MutexSys *)
             this_01.
             super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
             .super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl;
        MutexSys::lock((MutexSys *)
                       this_01.
                       super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
                       .super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl);
        if ((((atomic<embree::FastAllocator_*> *)
             ((long)this_01.
                    super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
                    .super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl + 8))->_M_b)
            ._M_p != (__pointer_type)0x0) {
          LOCK();
          paVar2 = &((((atomic<embree::FastAllocator_*> *)
                      ((long)this_01.
                             super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
                             .super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl + 8
                      ))->_M_b)._M_p)->bytesUsed;
          (paVar2->super___atomic_base<unsigned_long>)._M_i =
               (__int_type_conflict)
               ((long)*(void **)((long)this_01.
                                       super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
                                       .super__Head_base<0UL,_embree::FastAllocator_*,_false>.
                                       _M_head_impl + 0x68) +
               (long)(((((atomic<embree::FastAllocator::Block_*> *)
                        ((long)this_01.
                               super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
                               .super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl +
                        0xa8))->_M_b)._M_p)->align +
                     ((paVar2->super___atomic_base<unsigned_long>)._M_i - 0x2d)));
          UNLOCK();
          LOCK();
          paVar2 = &((((atomic<embree::FastAllocator_*> *)
                      ((long)this_01.
                             super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
                             .super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl + 8
                      ))->_M_b)._M_p)->bytesFree;
          (paVar2->super___atomic_base<unsigned_long>)._M_i =
               (long)*(void **)((long)this_01.
                                      super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
                                      .super__Head_base<0UL,_embree::FastAllocator_*,_false>.
                                      _M_head_impl + 0x58) +
               (long)(((atomic<embree::FastAllocator::Block_*> *)
                      ((long)this_01.
                             super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
                             .super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl +
                      0x98))->_M_b)._M_p +
               ((paVar2->super___atomic_base<unsigned_long>)._M_i -
               ((long)*(void **)((long)this_01.
                                       super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
                                       .super__Head_base<0UL,_embree::FastAllocator_*,_false>.
                                       _M_head_impl + 0x50) +
               (long)(((atomic<embree::FastAllocator::Block_*> *)
                      ((long)this_01.
                             super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
                             .super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl +
                      0x90))->_M_b)._M_p));
          UNLOCK();
          LOCK();
          paVar2 = &((((atomic<embree::FastAllocator_*> *)
                      ((long)this_01.
                             super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
                             .super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl + 8
                      ))->_M_b)._M_p)->bytesWasted;
          (paVar2->super___atomic_base<unsigned_long>)._M_i =
               (__int_type_conflict)
               ((long)*(void **)((long)this_01.
                                       super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
                                       .super__Head_base<0UL,_embree::FastAllocator_*,_false>.
                                       _M_head_impl + 0x70) +
               (long)(((((atomic<embree::FastAllocator::Block_*> *)
                        ((long)this_01.
                               super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
                               .super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl +
                        0xb0))->_M_b)._M_p)->align +
                     ((paVar2->super___atomic_base<unsigned_long>)._M_i - 0x2d)));
          UNLOCK();
        }
        *(void **)((long)this_01.
                         super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
                         .super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl + 0x68)
             = (void *)0x0;
        *(void **)((long)this_01.
                         super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
                         .super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl + 0x70)
             = (void *)0x0;
        *(void **)((long)this_01.
                         super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
                         .super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl + 0x58)
             = (void *)0x0;
        *(void **)((long)this_01.
                         super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
                         .super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl + 0x60)
             = (void *)0x0;
        *(void **)((long)this_01.
                         super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
                         .super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl + 0x48)
             = (void *)0x0;
        *(void **)((long)this_01.
                         super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
                         .super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl + 0x50)
             = (void *)0x0;
        if (this_00 == (FastAllocator *)0x0) {
          (((atomic<embree::FastAllocator::Block_*> *)
           ((long)this_01.
                  super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
                  .super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl + 0xa8))->_M_b
          )._M_p = (__pointer_type)0x0;
          (((atomic<embree::FastAllocator::Block_*> *)
           ((long)this_01.
                  super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
                  .super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl + 0xb0))->_M_b
          )._M_p = (__pointer_type)0x0;
          (((atomic<embree::FastAllocator::Block_*> *)
           ((long)this_01.
                  super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
                  .super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl + 0x98))->_M_b
          )._M_p = (__pointer_type)0x0;
          (((atomic<embree::FastAllocator::Block_*> *)
           ((long)this_01.
                  super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
                  .super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl + 0xa0))->_M_b
          )._M_p = (__pointer_type)0x0;
          (((atomic<embree::FastAllocator::Block_*> *)
           ((long)this_01.
                  super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
                  .super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl + 0x88))->_M_b
          )._M_p = (__pointer_type)0x0;
          (((atomic<embree::FastAllocator::Block_*> *)
           ((long)this_01.
                  super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
                  .super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl + 0x90))->_M_b
          )._M_p = (__pointer_type)0x0;
        }
        else {
          *(void **)((long)this_01.
                           super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
                           .super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl +
                    0x60) = (void *)this_00->defaultBlockSize;
          (((atomic<embree::FastAllocator::Block_*> *)
           ((long)this_01.
                  super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
                  .super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl + 0x88))->_M_b
          )._M_p = (__pointer_type)0x0;
          (((atomic<embree::FastAllocator::Block_*> *)
           ((long)this_01.
                  super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
                  .super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl + 0x90))->_M_b
          )._M_p = (__pointer_type)0x0;
          (((atomic<embree::FastAllocator::Block_*> *)
           ((long)this_01.
                  super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
                  .super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl + 0x98))->_M_b
          )._M_p = (__pointer_type)0x0;
          (((atomic<embree::FastAllocator::Block_*> *)
           ((long)this_01.
                  super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
                  .super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl + 0xa0))->_M_b
          )._M_p = (__pointer_type)0x0;
          (((atomic<embree::FastAllocator::Block_*> *)
           ((long)this_01.
                  super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
                  .super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl + 0xa8))->_M_b
          )._M_p = (__pointer_type)0x0;
          (((atomic<embree::FastAllocator::Block_*> *)
           ((long)this_01.
                  super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
                  .super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl + 0xb0))->_M_b
          )._M_p = (__pointer_type)0x0;
          (((atomic<embree::FastAllocator::Block_*> *)
           ((long)this_01.
                  super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
                  .super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl + 0xa0))->_M_b
          )._M_p = (__pointer_type)this_00->defaultBlockSize;
        }
        LOCK();
        (((atomic<embree::FastAllocator_*> *)
         ((long)this_01.
                super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
                .super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl + 8))->_M_b).
        _M_p = this_00;
        UNLOCK();
        local_1fc8._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
        local_1fc8[8] = true;
        local_1f80._M_t.
        super___uniq_ptr_impl<embree::FastAllocator,_std::default_delete<embree::FastAllocator>_>.
        _M_t.
        super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
        .super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl =
             (__uniq_ptr_data<embree::FastAllocator,_std::default_delete<embree::FastAllocator>,_true,_true>
              )(__uniq_ptr_data<embree::FastAllocator,_std::default_delete<embree::FastAllocator>,_true,_true>
                )this_01.
                 super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
                 .super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl;
        MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
        std::
        vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ::push_back(local_1f98,(value_type *)&local_1f80);
        Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)local_1fc8);
        Lock<embree::MutexSys>::~Lock(&local_1f90);
      }
      psVar6 = &(this_02->alloc0).bytesUsed;
      *psVar6 = local_1fb8._0_8_ + *psVar6;
      sVar7 = (this_02->alloc0).cur;
      This = (fast_allocator_regression_test *)(ulong)(-(int)sVar7 & 0xf);
      uVar5 = local_1fb8._0_8_ +
              (long)&((RegressionTest *)&((ThreadLocal2 *)This)->mutex)->_vptr_RegressionTest +
              sVar7;
      (this_02->alloc0).cur = uVar5;
      if ((this_02->alloc0).end < uVar5) {
        (this_02->alloc0).cur = sVar7;
        _Var3._M_head_impl = (ThreadLocal2 *)(this_02->alloc0).allocBlockSize;
        if (_Var3._M_head_impl < (ThreadLocal2 *)(local_1fb8._0_8_ << 2)) {
          This = (fast_allocator_regression_test *)local_1fb8;
          psVar6 = (size_t *)FastAllocator::malloc(this_00,(size_t)This);
        }
        else {
          local_1fc8._0_8_ = _Var3._M_head_impl;
          psVar6 = (size_t *)FastAllocator::malloc(this_00,(size_t)local_1fc8);
          (this_02->alloc0).ptr = (char *)psVar6;
          sVar7 = ((this_02->alloc0).end - (this_02->alloc0).cur) + (this_02->alloc0).bytesWasted;
          (this_02->alloc0).bytesWasted = sVar7;
          (this_02->alloc0).end = local_1fc8._0_8_;
          (this_02->alloc0).cur = local_1fb8._0_8_;
          if ((ulong)local_1fc8._0_8_ < (ulong)local_1fb8._0_8_) {
            (this_02->alloc0).cur = 0;
            local_1fc8._0_8_ = (this_02->alloc0).allocBlockSize;
            psVar6 = (size_t *)FastAllocator::malloc(this_00,(size_t)local_1fc8);
            (this_02->alloc0).ptr = (char *)psVar6;
            sVar7 = ((this_02->alloc0).end - (this_02->alloc0).cur) + (this_02->alloc0).bytesWasted;
            (this_02->alloc0).bytesWasted = sVar7;
            (this_02->alloc0).end = local_1fc8._0_8_;
            (this_02->alloc0).cur = local_1fb8._0_8_;
            if ((ulong)local_1fc8._0_8_ < (ulong)local_1fb8._0_8_) {
              (this_02->alloc0).cur = 0;
              psVar6 = (size_t *)0x0;
              This = (fast_allocator_regression_test *)local_1fb8._0_8_;
              goto LAB_001af9f1;
            }
          }
          (this_02->alloc0).bytesWasted = sVar7;
          This = (fast_allocator_regression_test *)local_1fb8._0_8_;
        }
      }
      else {
        psVar6 = &(this_02->alloc0).bytesWasted;
        *psVar6 = (long)&((RegressionTest *)&((ThreadLocal2 *)This)->mutex)->_vptr_RegressionTest +
                  *psVar6;
        psVar6 = (size_t *)((this_02->alloc0).ptr + (uVar5 - local_1fb8._0_8_));
      }
LAB_001af9f1:
      ptrs[lVar9] = psVar6;
      *psVar6 = (long)&pTVar1->parent + lVar9;
    }
    for (lVar9 = 0; lVar9 != 1000; lVar9 = lVar9 + 1) {
      if ((long)&pTVar1->parent + lVar9 != *ptrs[lVar9]) {
        LOCK();
        (((atomic<unsigned_long> *)(local_1fb8._16_8_ + 0x30))->super___atomic_base<unsigned_long>).
        _M_i = (((atomic<unsigned_long> *)(local_1fb8._16_8_ + 0x30))->
               super___atomic_base<unsigned_long>)._M_i + 1;
        UNLOCK();
      }
    }
    BarrierSys::wait((BarrierSys *)local_1fb8._8_8_,This);
    local_1fa0 = local_1fa0 + 1;
  } while( true );
}

Assistant:

static void thread_alloc(fast_allocator_regression_test* This)
    {
      FastAllocator::CachedAllocator threadalloc = This->alloc->getCachedAllocator();

      size_t* ptrs[1000];
      for (size_t j=0; j<1000; j++)
      {
        This->barrier.wait();
        for (size_t i=0; i<1000; i++) {
          ptrs[i] = (size_t*) threadalloc.malloc0(sizeof(size_t)+(i%32));
          *ptrs[i] = size_t(threadalloc.talloc0) + i;
        }
        for (size_t i=0; i<1000; i++) {
          if (*ptrs[i] != size_t(threadalloc.talloc0) + i) 
            This->numFailed++;
        }
        This->barrier.wait();
      }
    }